

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack23_8(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = *(ulong *)(in + 2);
  uVar2 = *(ulong *)in;
  auVar9._8_4_ = 0x7fffff;
  auVar9._0_8_ = 0x7fffff007fffff;
  auVar9._12_4_ = 0x7fffff;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar5 = vpsllvd_avx2(auVar7,_DAT_001aa390);
  auVar3._8_8_ = 0x7ffff0007c0000;
  auVar3._0_8_ = 0x7ffff0007c0000;
  auVar4 = vpandq_avx512vl(auVar5,auVar3);
  *out = (uint)uVar2 & 0x7fffff;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5 = vshufps_avx(auVar5,auVar7,4);
  auVar3 = vpsrlvd_avx2(auVar5,_DAT_001aa3b0);
  auVar5 = vpinsrd_avx(auVar9,((uint)(uVar2 >> 0x20) & 0x3fff) << 9,0);
  uVar2 = *(ulong *)(in + 4);
  auVar5 = vpunpckldq_avx(auVar5,auVar4);
  auVar4 = vpor_avx(auVar3,auVar5);
  auVar5 = vpand_avx(auVar3,auVar9);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar5 = vpblendd_avx2(auVar4,auVar5,4);
  *(undefined1 (*) [16])(out + 1) = auVar5;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar5 = vpermi2d_avx512vl(auVar3,auVar8,auVar6);
  auVar3 = vpsrlvd_avx2(auVar5,_DAT_001aa3c0);
  auVar5 = vpsllvd_avx2(auVar6,_DAT_0019e530);
  auVar4._8_8_ = 0x400000007fe000;
  auVar4._0_8_ = 0x400000007fe000;
  auVar5 = vpternlogq_avx512vl(auVar5,auVar3,auVar4,0xec);
  *(long *)(out + 5) = auVar5._0_8_;
  out[7] = (uint)(uVar2 >> 0x21) & 0x7fffff;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack23_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 14)) << (23 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 5)) << (23 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 23);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 19)) << (23 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 10)) << (23 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 1)) << (23 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 23);
  out++;

  return in + 1;
}